

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QList<QByteArray> * __thiscall
QByteArray::split(QList<QByteArray> *__return_storage_ptr__,QByteArray *this,char sep)

{
  qsizetype qVar1;
  long pos;
  long in_FS_OFFSET;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_50.d.ptr = (this->d).ptr;
  local_50.d.d = (Data *)(this->d).size;
  pos = 0;
  qVar1 = QByteArrayView::indexOf((QByteArrayView *)&local_50,sep,0);
  if (qVar1 != -1) {
    pos = 0;
    do {
      mid(&local_50,this,pos,qVar1 - pos);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_50);
      QList<QByteArray>::end(__return_storage_ptr__);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        }
      }
      pos = qVar1 + 1;
      local_50.d.ptr = (this->d).ptr;
      local_50.d.d = (Data *)(this->d).size;
      qVar1 = QByteArrayView::indexOf((QByteArrayView *)&local_50,sep,pos);
    } while (qVar1 != -1);
  }
  mid(&local_50,this,pos,-1);
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
            ((QMovableArrayOps<QByteArray> *)__return_storage_ptr__,(__return_storage_ptr__->d).size
             ,&local_50);
  QList<QByteArray>::end(__return_storage_ptr__);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QByteArray::split(char sep) const
{
    QList<QByteArray> list;
    qsizetype start = 0;
    qsizetype end;
    while ((end = indexOf(sep, start)) != -1) {
        list.append(mid(start, end - start));
        start = end + 1;
    }
    list.append(mid(start));
    return list;
}